

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

TestMiniParseResult *
google::protobuf::internal::TcParser::TestMiniParse
          (TestMiniParseResult *__return_storage_ptr__,MessageLite *msg,char *ptr,ParseContext *ctx,
          TcFieldData data,TcParseTableBase *table,uint64_t hasbits)

{
  TailCallParseFunc p_Var1;
  ParseContext *ctx_00;
  char *ptr_00;
  MessageLite *msg_00;
  uint7 uVar3;
  FieldEntry *pFVar2;
  char *local_1c8;
  TestMiniParseResult *result;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  undefined4 uStack_16c;
  TailCallParseFunc parse_fn;
  int field_type;
  uint64_t entry_offset;
  undefined4 uStack_12c;
  FieldEntry *entry;
  code *local_108;
  undefined8 local_100;
  FieldEntry *local_f8;
  char *local_f0;
  uint local_e4;
  TestMiniParseResult *pTStack_e0;
  uint32_t tag;
  TestMiniParseResult *test_out;
  TcParseTableBase *local_d0;
  ParseContext *local_c8;
  char *local_c0;
  MessageLite *local_b8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_b0;
  ulong local_a8;
  uint64_t res;
  char *local_98;
  char *local_90;
  byte *local_88;
  ulong local_80;
  byte *local_78;
  ulong local_70;
  byte *local_68;
  ulong local_60;
  byte *local_58;
  ulong local_50;
  undefined4 local_44;
  ulong local_40;
  undefined4 local_34;
  ulong local_30;
  undefined4 local_24;
  ulong local_20;
  undefined4 local_14;
  ulong local_10;
  
  memset(__return_storage_ptr__,0,0x20);
  test_out = (TestMiniParseResult *)hasbits;
  res = (uint64_t)&local_e4;
  local_e4 = (uint)(byte)*ptr;
  local_a8 = (ulong)(int)local_e4;
  if (local_a8 < 0x80) {
    local_90 = ptr + 1;
  }
  else {
    local_58 = (byte *)(ptr + 1);
    uVar3 = (uint7)((local_a8 << 0x39) >> 8);
    local_50 = CONCAT71(uVar3,*local_58);
    if ((*local_58 & 0x80) == 0) {
      local_14 = 7;
      local_e4 = (int)local_50 << 7 | (uint)((local_a8 << 0x39) >> 0x39);
      local_90 = ptr + 2;
      local_a8 = local_50;
      local_10 = local_50;
    }
    else {
      local_68 = (byte *)(ptr + 2);
      uVar3 = uVar3 >> 7 | (uint7)((local_50 << 0x39) >> 8);
      local_60 = CONCAT71(uVar3,*local_68);
      if ((*local_68 & 0x80) == 0) {
        local_24 = 0xe;
        local_e4 = (int)local_60 << 0xe | (uint)(uVar3 >> 0x2a);
        local_90 = ptr + 3;
        local_a8 = local_60;
        local_20 = local_60;
      }
      else {
        local_78 = (byte *)(ptr + 3);
        uVar3 = uVar3 >> 7 | (uint7)((local_60 << 0x39) >> 8);
        local_70 = CONCAT71(uVar3,*local_78);
        if ((*local_78 & 0x80) == 0) {
          local_34 = 0x15;
          local_e4 = (int)local_70 << 0x15 | (uint)(uVar3 >> 0x23);
          local_90 = ptr + 4;
          local_a8 = local_70;
          local_30 = local_70;
        }
        else {
          local_88 = (byte *)(ptr + 4);
          uVar3 = uVar3 >> 7 | (uint7)((local_70 << 0x39) >> 8);
          local_80 = CONCAT71(uVar3,*local_88);
          local_a8 = local_80;
          if ((*local_88 & 0x80) == 0) {
            local_44 = 0x1c;
            local_e4 = (int)local_80 << 0x1c | (uint)(uVar3 >> 0x1c);
            local_90 = ptr + 5;
            local_40 = local_80;
          }
          else {
            local_e4 = 0;
            local_90 = (char *)0x0;
          }
        }
      }
    }
  }
  local_c0 = local_90;
  pTStack_e0 = __return_storage_ptr__;
  local_d0 = table;
  local_c8 = ctx;
  local_b8 = msg;
  local_b0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)__return_storage_ptr__;
  local_98 = ptr;
  if (local_90 == (char *)0x0) {
    memset(&local_108,0,0x20);
    msg_00 = local_b8;
    ptr_00 = local_c0;
    ctx_00 = local_c8;
    local_108 = Error;
    pTStack_e0->called_func = Error;
    *(undefined8 *)&pTStack_e0->tag = local_100;
    pTStack_e0->found_entry = local_f8;
    pTStack_e0->ptr = local_f0;
    TcFieldData::TcFieldData((TcFieldData *)&entry);
    local_1c8 = Error(msg_00,ptr_00,ctx_00,(TcFieldData)entry,local_d0,(uint64_t)test_out);
  }
  else {
    pFVar2 = FindFieldEntry(table,local_e4 >> 3);
    if (pFVar2 == (FieldEntry *)0x0) {
      pTStack_e0->called_func = local_d0->fallback;
      *(ulong *)&pTStack_e0->tag = CONCAT44(uStack_12c,local_e4);
      pTStack_e0->found_entry = (FieldEntry *)0x0;
      pTStack_e0->ptr = (char *)0x0;
      local_b0.data._4_4_ = 0;
      local_b0.data._0_4_ = local_e4;
      local_1c8 = (*local_d0->fallback)
                            (local_b8,local_c0,local_c8,(TcFieldData)local_b0,local_d0,
                             (uint64_t)test_out);
    }
    else {
      local_b0.data = (long)pFVar2 - (long)local_d0 << 0x20 | (ulong)local_e4;
      p_Var1 = *(TailCallParseFunc *)
                (MiniParse<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)
                 ::kMiniParseTable + (long)(int)(pFVar2->type_card & 0xf) * 8);
      pTStack_e0->called_func = p_Var1;
      *(ulong *)&pTStack_e0->tag = CONCAT44(uStack_16c,local_e4);
      pTStack_e0->found_entry = pFVar2;
      pTStack_e0->ptr = (char *)0x0;
      local_1c8 = (*p_Var1)(local_b8,local_c0,local_c8,(TcFieldData)local_b0,local_d0,
                            (uint64_t)test_out);
    }
  }
  __return_storage_ptr__->ptr = local_1c8;
  return __return_storage_ptr__;
}

Assistant:

PROTOBUF_NOINLINE TcParser::TestMiniParseResult TcParser::TestMiniParse(
    PROTOBUF_TC_PARAM_DECL) {
  TestMiniParseResult result = {};
  data.data = reinterpret_cast<uintptr_t>(&result);
  result.ptr = MiniParse<true>(PROTOBUF_TC_PARAM_PASS);
  return result;
}